

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void std::__inplace_merge<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (long __first,long __middle,long __last)

{
  QGraphicsItem **ppQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  pair<QGraphicsItem_**,_long> pVar5;
  
  if (__middle != __last && __first != __middle) {
    lVar3 = __middle - __first >> 3;
    lVar4 = __last - __middle >> 3;
    lVar2 = lVar3;
    if (lVar4 < lVar3) {
      lVar2 = lVar4;
    }
    pVar5 = get_temporary_buffer<QGraphicsItem*>(lVar2);
    lVar2 = pVar5.second;
    ppQVar1 = pVar5.first;
    if (ppQVar1 == (QGraphicsItem **)0x0) {
      __merge_without_buffer<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
                (__first,__middle,__last,lVar3,lVar4);
      lVar2 = 0;
    }
    else {
      __merge_adaptive<QList<QGraphicsItem*>::iterator,long_long,QGraphicsItem**,__gnu_cxx::__ops::_Iter_less_iter>
                (__first,__middle,__last,lVar3,lVar4,ppQVar1,lVar2);
    }
    operator_delete(ppQVar1,lVar2 << 3);
    return;
  }
  return;
}

Assistant:

inline constexpr bool operator==(iterator o) const { return i == o.i; }